

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v6::detail::buffer<char>_> __thiscall
fmt::v6::detail::write<char,char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>>
          (detail *this,back_insert_iterator<fmt::v6::detail::buffer<char>_> out,
          basic_string_view<char> s,basic_format_specs<char> *specs)

{
  type tVar1;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar2;
  char *n;
  size_t extraout_RDX;
  basic_string_view<char> s_00;
  basic_string_view<char> s_01;
  size_t local_88;
  anon_class_16_2_3f014a30 local_80;
  size_t local_70;
  basic_string_view<char> local_68;
  size_t local_58;
  size_t width;
  char *local_48;
  ulong local_40;
  size_t size;
  char *data;
  basic_format_specs<char> *specs_local;
  basic_string_view<char> s_local;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> out_local;
  
  n = (char *)s.size_;
  s_local.data_ = s.data_;
  data = n;
  specs_local = (basic_format_specs<char> *)out.container;
  s_local.size_ = (size_t)this;
  size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&specs_local);
  local_40 = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  if (-1 < *(int *)(data + 4)) {
    tVar1 = to_unsigned<int>(*(int *)(data + 4));
    if (tVar1 < local_40) {
      width = (size_t)specs_local;
      local_48 = s_local.data_;
      tVar1 = to_unsigned<int>(*(int *)(data + 4));
      s_00.size_._0_4_ = tVar1;
      s_00.data_ = local_48;
      s_00.size_._4_4_ = 0;
      local_40 = code_point_index<char>((detail *)width,s_00,(size_t)n);
    }
  }
  if (*(int *)data == 0) {
    local_88 = 0;
  }
  else {
    basic_string_view<char>::basic_string_view(&local_68,(char *)size,local_40);
    s_01.size_ = extraout_RDX;
    s_01.data_ = (char *)local_68.size_;
    local_88 = count_code_points((detail *)local_68.data_,s_01);
  }
  local_58 = local_88;
  local_70 = s_local.size_;
  local_80.data = (char *)size;
  local_80.size = local_40;
  bVar2 = write_padded<(fmt::v6::align::type)1,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::write<char,char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>>(std::back_insert_iterator<fmt::v6::detail::buffer<char>>,fmt::v6::basic_string_view<char>,fmt::v6::basic_format_specs<char>const&)::_lambda(char*)_1_>
                    ((back_insert_iterator<fmt::v6::detail::buffer<char>_>)s_local.size_,
                     (basic_format_specs<char> *)data,local_40,local_88,&local_80);
  return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs = {}) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}